

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_0::Texture2DLodControlTestInstance::Texture2DLodControlTestInstance
          (Texture2DLodControlTestInstance *this,Context *context,
          Texture2DMipmapTestCaseParameters *testParameters)

{
  TestTexture2DSp *this_00;
  uint uVar1;
  TestTexture2D *this_01;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  RGBA local_7c;
  TextureRenderer *local_78;
  Texture2DLodControlTestInstance *local_70;
  Vec4 local_68;
  SharedPtr<vkt::pipeline::TestTexture2D> local_58 [2];
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DLodControlTestInstance_00bde5f8;
  this->m_texWidth = 0x40;
  this->m_texHeight = 0x40;
  Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
            (&this->m_testParameters,testParameters);
  this->m_minFilter =
       (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
       minFilter;
  this_00 = &this->m_texture;
  local_70 = this;
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(this_00,(TestTexture2D *)0x0);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture2DTestCaseParameters).
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  uVar4 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar4 = this->m_texWidth;
  }
  if (uVar4 == 0) {
    uVar3 = 0x20;
  }
  else {
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  local_78 = &this->m_renderer;
  this_01 = (TestTexture2D *)operator_new(0x70);
  local_68.m_data._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D
            (this_01,(TextureFormat *)&local_68,this->m_texWidth,this->m_texHeight);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(local_58,this_01);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::operator=(this_00,local_58);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr(local_58);
  for (uVar4 = 0; 0x20 - uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (*(this_00->m_ptr->super_TestTexture)._vptr_TestTexture[7])
              (local_58,this_00->m_ptr,(ulong)uVar4,0);
    uVar1 = (int)(0xff / (long)(int)(0x1f - uVar3)) * uVar4;
    uVar2 = uVar1;
    if (0xfe < uVar1) {
      uVar2 = 0xff;
    }
    local_7c.m_value = uVar2 * 0x10100 ^ 0xff00ffff;
    if ((int)uVar1 < 0) {
      local_7c.m_value = 0xff00ffff;
    }
    tcu::RGBA::toVec(&local_7c);
    tcu::clear((PixelBufferAccess *)local_58,&local_68);
  }
  util::TextureRenderer::add2DTexture(local_78,this_00);
  return;
}

Assistant:

Texture2DLodControlTestInstance::Texture2DLodControlTestInstance (Context& context, const Texture2DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(64) //64
	, m_texHeight		(64)//64
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat	format		= VK_FORMAT_R8G8B8A8_UNORM;
	const int		numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(format), m_texWidth, m_texHeight));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec());
	}

	m_renderer.add2DTexture(m_texture);
}